

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

RefPtr<wabt::interp::Tag> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Tag,wabt::interp::Store&,wabt::interp::TagType&>
          (RefPtr<wabt::interp::Tag> *__return_storage_ptr__,Store *this,Store *args,TagType *args_1
          )

{
  Tag *this_00;
  Ref ref;
  Tag *local_60;
  TagType local_58;
  
  this_00 = (Tag *)operator_new(0x68);
  TagType::TagType(&local_58,args_1);
  Tag::Tag(this_00,(Store *)args_1,&local_58);
  local_60 = this_00;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Tag*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_60);
  TagType::~TagType(&local_58);
  RefPtr<wabt::interp::Tag>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}